

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O2

double __thiscall ipx::Basis::DensityInverse(Basis *this)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  vector<int,_std::allocator<int>_> rowcounts;
  allocator_type local_39;
  double local_38;
  _Vector_base<int,_std::allocator<int>_> local_30;
  
  uVar1 = this->model_->num_rows_;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_30,(long)(int)uVar1,&local_39);
  uVar2 = 0;
  SymbolicInvert(this,local_30._M_impl.super__Vector_impl_data._M_start,(Int *)0x0);
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar2;
  }
  local_38 = 0.0;
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    local_38 = local_38 +
               (double)local_30._M_impl.super__Vector_impl_data._M_start[uVar2] / (double)(int)uVar1
    ;
  }
  local_38 = local_38 / (double)(int)uVar1;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_30);
  return local_38;
}

Assistant:

double Basis::DensityInverse() const {
    Int m = model_.rows();
    std::vector<Int> rowcounts(m);
    SymbolicInvert(rowcounts.data(), nullptr);
    // Accumulating rowcounts would result in overflow for large LPs.
    double density = 0.0;
    for (Int i = 0; i < m; i++)
        density += 1.0*rowcounts[i]/m;
    return density/m;
}